

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

bool __thiscall
glcts::GeometryShaderMaxInvocationsTest::verifyResultOfSingleInvocationPass
          (GeometryShaderMaxInvocationsTest *this,uchar *result_image)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  MessageBuilder local_698;
  uint local_518;
  uint local_514;
  uint y4_1;
  uint x4_1;
  undefined1 local_389;
  uint local_388;
  uint uStack_384;
  bool is_pixel_valid_1;
  uint center_y_1;
  uint center_x_1;
  uint y3_1;
  uint y2_1;
  uint y1_1;
  uint x3_1;
  uint x2_1;
  uint x1_1;
  uint i;
  uint local_1e0 [2];
  uint y4;
  uint x4;
  MessageBuilder local_1c8;
  undefined1 local_41;
  uint local_40;
  uint uStack_3c;
  bool is_pixel_valid;
  uint center_y;
  uint center_x;
  uint y3;
  uint y2;
  uint y1;
  uint x3;
  uint x2;
  uint x1;
  uchar *result_image_local;
  GeometryShaderMaxInvocationsTest *this_local;
  
  x3 = 0;
  y1 = 0;
  y2 = 8;
  y3 = 0;
  center_x = 8;
  center_y = 8;
  uStack_3c = 2;
  local_40 = 5;
  _x2 = result_image;
  result_image_local = (uchar *)this;
  local_41 = TestCaseBase::comparePixel
                       (&this->super_TestCaseBase,result_image,2,5,this->m_texture_width,9,4,'\0',
                        0xff,'\0','\0');
  if ((bool)local_41) {
    local_1e0[1] = 8;
    local_1e0[0] = 8;
    local_41 = TestCaseBase::comparePixel
                         (&this->super_TestCaseBase,_x2,8,8,this->m_texture_width,9,4,0xff,'\0','\0'
                          ,'\0');
    if ((bool)local_41) {
      for (x2_1 = 1; x2_1 < (uint)this->m_max_geometry_shader_invocations; x2_1 = x2_1 + 1) {
        x3_1 = x2_1 * 9;
        y1_1 = x2_1 * 9;
        y2_1 = (x2_1 + 1) * 9 - 1;
        y3_1 = 0;
        center_x_1 = 8;
        center_y_1 = 8;
        uStack_384 = (x2_1 * 0x12 + y2_1) / 3;
        local_388 = 5;
        local_389 = TestCaseBase::comparePixel
                              (&this->super_TestCaseBase,_x2,uStack_384,5,this->m_texture_width,9,4,
                               0xff,'\0','\0','\0');
        if (!(bool)local_389) {
          pTVar1 = tcu::TestContext::getLog
                             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&y4_1,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar2 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&y4_1,(char (*) [19])"Invalid pixel at [");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffc7c);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b7da8d);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_388);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [20])"]! Triangle index: ");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&x2_1);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])" from range <0:");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_max_geometry_shader_invocations);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2c23dab);
          tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&y4_1);
          return false;
        }
        local_514 = (x2_1 + 1) * 9 - 1;
        local_518 = 8;
        local_389 = TestCaseBase::comparePixel
                              (&this->super_TestCaseBase,_x2,local_514,8,this->m_texture_width,9,4,
                               0xff,'\0','\0','\0');
        if (!(bool)local_389) {
          pTVar1 = tcu::TestContext::getLog
                             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_698,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar2 = tcu::MessageBuilder::operator<<(&local_698,(char (*) [19])"Invalid pixel at [");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_514);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b7da8d);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_518);
          pMVar2 = tcu::MessageBuilder::operator<<
                             (pMVar2,(char (*) [26])"]! Background for index: ");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&x2_1);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])" from range <0:");
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_max_geometry_shader_invocations);
          pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2c23dab);
          tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_698);
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      pTVar1 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&i,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&i,(char (*) [19])"Invalid pixel at [");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1e0 + 1);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b7da8d);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1e0);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [26])"]! Background for index: ");
      x1_1 = 0;
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&x1_1);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])" from range <0:");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_max_geometry_shader_invocations);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar1 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1c8,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [19])"Invalid pixel at [");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xffffffffffffffc4);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b7da8d);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_40);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [20])"]! Triangle index: ");
    y4 = 0;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&y4);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])" from range <0:");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_max_geometry_shader_invocations);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2c23dab);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool GeometryShaderMaxInvocationsTest::verifyResultOfSingleInvocationPass(unsigned char* result_image)
{
	/* Only one triangle should be drawn, verify that pixel at its center was modified */
	{
		const unsigned int x1 = 0;
		const unsigned int x2 = 0;
		const unsigned int x3 = m_triangle_edge_length - 1;

		const unsigned int y1 = 0;
		const unsigned int y2 = m_triangle_edge_length - 1;
		const unsigned int y3 = m_triangle_edge_length - 1;

		const unsigned int center_x = (x1 + x2 + x3) / 3;
		const unsigned int center_y = (y1 + y2 + y3) / 3;

		bool is_pixel_valid = comparePixel(result_image, center_x, center_y, m_texture_width, m_texture_height,
										   m_texture_pixel_size, 0, 255, 0, 0);

		if (false == is_pixel_valid)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel at [" << center_x << ";" << center_y
							   << "]! "
								  "Triangle index: "
							   << 0 << " from range <0:" << m_max_geometry_shader_invocations << ")."
							   << tcu::TestLog::EndMessage;

			return false;
		}

		/* Verify that background's pixel was not modified */
		const unsigned int x4 = m_triangle_edge_length - 1;
		const unsigned int y4 = m_triangle_edge_length - 1;

		is_pixel_valid =
			comparePixel(result_image, x4, y4, m_texture_width, m_texture_height, m_texture_pixel_size, 255, 0, 0, 0);

		if (false == is_pixel_valid)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel at [" << x4 << ";" << y4
							   << "]! "
								  "Background for index: "
							   << 0 << " from range <0:" << m_max_geometry_shader_invocations << ")."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	for (unsigned int i = 1; i < (unsigned int)m_max_geometry_shader_invocations; ++i)
	{
		/* Verify that pixel at triangle's center was not modified */
		const unsigned int x1 = m_triangle_edge_length * i;
		const unsigned int x2 = m_triangle_edge_length * i;
		const unsigned int x3 = m_triangle_edge_length * (i + 1) - 1;

		const unsigned int y1 = 0;
		const unsigned int y2 = m_triangle_edge_length - 1;
		const unsigned int y3 = m_triangle_edge_length - 1;

		const unsigned int center_x = (x1 + x2 + x3) / 3;
		const unsigned int center_y = (y1 + y2 + y3) / 3;

		bool is_pixel_valid = comparePixel(result_image, center_x, center_y, m_texture_width, m_texture_height,
										   m_texture_pixel_size, 255, 0, 0, 0);

		if (false == is_pixel_valid)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel at [" << center_x << ";" << center_y
							   << "]! "
								  "Triangle index: "
							   << i << " from range <0:" << m_max_geometry_shader_invocations << ")."
							   << tcu::TestLog::EndMessage;

			return false;
		}

		/* Verify that background's pixel was not modified */
		const unsigned int x4 = m_triangle_edge_length * (i + 1) - 1;
		const unsigned int y4 = m_triangle_edge_length - 1;

		is_pixel_valid =
			comparePixel(result_image, x4, y4, m_texture_width, m_texture_height, m_texture_pixel_size, 255, 0, 0, 0);

		if (false == is_pixel_valid)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel at [" << x4 << ";" << y4
							   << "]! "
								  "Background for index: "
							   << i << " from range <0:" << m_max_geometry_shader_invocations << ")."
							   << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}